

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::TPZParFrontMatrix(TPZParFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                    *this,void **vtt)

{
  TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10> *in_RSI;
  TPZStack<TPZEqnArray<std::complex<double>_>_*,_10> *in_RDI;
  TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *unaff_retaddr;
  int64_t in_stack_ffffffffffffffe8;
  TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10> *this_00;
  
  this_00 = in_RSI;
  TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  ::TPZFrontMatrix(unaff_retaddr,(void **)in_RDI);
  (in_RDI->super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>).
  super_TPZVec<TPZEqnArray<std::complex<double>_>_*>._vptr_TPZVec =
       (in_RSI->super_TPZVec<TPZEqnArray<std::complex<double>_>_*>)._vptr_TPZVec;
  TPZStack<TPZEqnArray<std::complex<double>_>_*,_10>::TPZStack(in_RDI);
  *(undefined4 *)
   &in_RDI[0x753].super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.
    super_TPZVec<TPZEqnArray<std::complex<double>_>_*>._vptr_TPZVec = 0;
  in_RDI[0x753].super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<double>_>_*>.fNAlloc = 0;
  in_RDI[0x753].super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.fExtAlloc[0] =
       (TPZEqnArray<std::complex<double>_> *)0x0;
  in_RDI[0x753].super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<double>_>_*>.fStore =
       (TPZEqnArray<std::complex<double>_> **)0x0;
  in_RDI[0x753].super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<double>_>_*>.fNElements = 0;
  in_RDI[0x753].super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.fExtAlloc[1] =
       (TPZEqnArray<std::complex<double>_> *)0x0;
  std::mutex::mutex((mutex *)0x1d473d8);
  std::condition_variable::condition_variable
            ((condition_variable *)
             (in_RDI[0x753].super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.fExtAlloc +
             2));
  TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>::Resize(this_00,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix():
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}